

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O1

bool __thiscall
sf::Shader::loadFromStream
          (Shader *this,InputStream *vertexShaderStream,InputStream *geometryShaderStream,
          InputStream *fragmentShaderStream)

{
  bool bVar1;
  ostream *poVar2;
  vector<char,_std::allocator<char>_> fragmentShader;
  vector<char,_std::allocator<char>_> geometryShader;
  vector<char,_std::allocator<char>_> vertexShader;
  vector<char,_std::allocator<char>_> local_78;
  vector<char,_std::allocator<char>_> local_58;
  vector<char,_std::allocator<char>_> local_38;
  
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar1 = anon_unknown.dwarf_51134b::getStreamContents(vertexShaderStream,&local_38);
  if (bVar1) {
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (char *)0x0;
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = anon_unknown.dwarf_51134b::getStreamContents(geometryShaderStream,&local_58);
    if (bVar1) {
      local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (char *)0x0;
      local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      bVar1 = anon_unknown.dwarf_51134b::getStreamContents(fragmentShaderStream,&local_78);
      if (bVar1) {
        bVar1 = compile(this,local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start,
                        local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      else {
        poVar2 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,"Failed to read fragment shader from stream",0x2a);
        std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        bVar1 = false;
      }
      if (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (char *)0x0) {
        operator_delete(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      poVar2 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"Failed to read geometry shader from stream",0x2a);
      std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      bVar1 = false;
    }
    if (local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    poVar2 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Failed to read vertex shader from stream",0x28);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    bVar1 = false;
  }
  if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool Shader::loadFromStream(InputStream& vertexShaderStream, InputStream& geometryShaderStream, InputStream& fragmentShaderStream)
{
    // Read the vertex shader code from the stream
    std::vector<char> vertexShader;
    if (!getStreamContents(vertexShaderStream, vertexShader))
    {
        err() << "Failed to read vertex shader from stream" << std::endl;
        return false;
    }

    // Read the geometry shader code from the stream
    std::vector<char> geometryShader;
    if (!getStreamContents(geometryShaderStream, geometryShader))
    {
        err() << "Failed to read geometry shader from stream" << std::endl;
        return false;
    }

    // Read the fragment shader code from the stream
    std::vector<char> fragmentShader;
    if (!getStreamContents(fragmentShaderStream, fragmentShader))
    {
        err() << "Failed to read fragment shader from stream" << std::endl;
        return false;
    }

    // Compile the shader program
    return compile(&vertexShader[0], &geometryShader[0], &fragmentShader[0]);
}